

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

void Kernel::InferenceStore::Smt2ProofCheckPrinter::outputAppl(ostream *out,Term *t)

{
  bool bVar1;
  SpecialFunctor SVar2;
  uint uVar3;
  uint uVar4;
  SpecialTermData *this;
  VList *l;
  undefined8 uVar5;
  Term *in_RSI;
  Term *in_RDI;
  uint in_stack_0000005c;
  ostream *in_stack_00000060;
  uint i;
  bool isPredicate;
  TermList binding;
  VList *variables;
  SpecialTermData *sd;
  SpecialFunctor f;
  char *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  Term *in_stack_ffffffffffffff08;
  TermList in_stack_ffffffffffffff10;
  Term *in_stack_ffffffffffffff48;
  bool local_91;
  Formula *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar6;
  
  bVar1 = Term::isSpecial((Term *)0x86c694);
  if (bVar1) {
    SVar2 = Term::specialFunctor((Term *)0x86c6aa);
    this = Term::getSpecialData(in_RSI);
    switch(SVar2) {
    case ITE:
      std::operator<<((ostream *)in_RDI,"(ite ");
      Term::SpecialTermData::getCondition(this);
      outputFormula((ostream *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
      Term::termArg(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
      outputTerm((ostream *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
      Term::termArg(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
      outputTerm((ostream *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
      std::operator<<((ostream *)in_RDI,")");
      break;
    case LET:
      std::operator<<((ostream *)in_RDI,"(let ((");
      l = Term::SpecialTermData::getVariables(this);
      bVar1 = Lib::List<unsigned_int>::isNonEmpty(l);
      if (bVar1) {
        uVar5 = __cxa_allocate_exception(0x50);
        Lib::UserErrorException::Exception
                  ((UserErrorException *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8);
        __cxa_throw(uVar5,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      Term::SpecialTermData::getBinding((SpecialTermData *)in_stack_ffffffffffffff08);
      bVar1 = TermList::isTerm((TermList *)0x86c7e5);
      local_91 = false;
      if (bVar1) {
        TermList::term((TermList *)0x86c801);
        local_91 = Term::isBoolean(in_stack_ffffffffffffff48);
      }
      std::operator<<((ostream *)in_RDI,"?");
      if (local_91 == false) {
        Term::SpecialTermData::getFunctor
                  ((SpecialTermData *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
        ;
        outputFunctionName(in_stack_00000060,in_stack_0000005c);
      }
      else {
        Term::SpecialTermData::getFunctor
                  ((SpecialTermData *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
        ;
        outputPredicateName((ostream *)in_stack_ffffffffffffff10._content,
                            (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      }
      std::operator<<((ostream *)in_RDI," ");
      outputTerm((ostream *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
      std::operator<<((ostream *)in_RDI,"))");
      Term::termArg(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
      outputTerm((ostream *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
      std::operator<<((ostream *)in_RDI,")");
      break;
    case FORMULA:
      Term::SpecialTermData::getFormula(this);
      outputFormula((ostream *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
      break;
    case TUPLE:
      uVar5 = __cxa_allocate_exception(0x50);
      Lib::UserErrorException::Exception
                ((UserErrorException *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                 ,in_stack_fffffffffffffef8);
      __cxa_throw(uVar5,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    case LET_TUPLE:
      uVar5 = __cxa_allocate_exception(0x50);
      Lib::UserErrorException::Exception
                ((UserErrorException *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                 ,in_stack_fffffffffffffef8);
      __cxa_throw(uVar5,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    case LAMBDA:
      uVar5 = __cxa_allocate_exception(0x50);
      Lib::UserErrorException::Exception
                ((UserErrorException *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                 ,in_stack_fffffffffffffef8);
      __cxa_throw(uVar5,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    case MATCH:
      uVar5 = __cxa_allocate_exception(0x50);
      Lib::UserErrorException::Exception
                ((UserErrorException *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                 ,in_stack_fffffffffffffef8);
      __cxa_throw(uVar5,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
  }
  else {
    uVar3 = Term::numTermArguments(in_stack_ffffffffffffff08);
    if (uVar3 != 0) {
      std::operator<<((ostream *)in_RDI,"(");
    }
    bVar1 = Term::isLiteral((Term *)0x86cb95);
    if (bVar1) {
      in_stack_ffffffffffffff10._content = (uint64_t)in_RDI;
      Term::functor(in_RSI);
      outputPredicateName((ostream *)in_stack_ffffffffffffff10._content,
                          (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    }
    else {
      in_stack_ffffffffffffff08 = in_RDI;
      Term::functor(in_RSI);
      outputFunctionName(in_stack_00000060,in_stack_0000005c);
    }
    uVar3 = 0;
    while (uVar6 = uVar3, uVar4 = Term::numTermArguments(in_stack_ffffffffffffff08), uVar3 < uVar4)
    {
      std::operator<<((ostream *)in_RDI," ");
      Term::termArg(in_stack_ffffffffffffff08,uVar3);
      outputTerm((ostream *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
      uVar3 = uVar6 + 1;
    }
    uVar3 = Term::numTermArguments(in_stack_ffffffffffffff08);
    if (uVar3 != 0) {
      std::operator<<((ostream *)in_RDI,")");
    }
  }
  return;
}

Assistant:

static void outputAppl(std::ostream& out, Term* t)
  {

    if (t->isSpecial()) {
      auto f = t->specialFunctor();
      const Term::SpecialTermData* sd = t->getSpecialData();
      switch(f) {
        case SpecialFunctor::FORMULA: outputFormula(out, sd->getFormula()); return;
        case SpecialFunctor::LET: {
          out << "(let ((";
          VList* variables = sd->getVariables();
          if (VList::isNonEmpty(variables)) 
            throw UserErrorException("bindings with variables are not supperted in smt2 proofcheck");

          auto binding = sd->getBinding();
          bool isPredicate = binding.isTerm() && binding.term()->isBoolean();

          out << "?";
          if (isPredicate) {
            outputPredicateName(out, sd->getFunctor());
          } else {
            outputFunctionName(out, sd->getFunctor());
          }
          out << " ";
          outputTerm(out, binding);
          out << "))";
          ASS_EQ(t->numTermArguments(), 1)
          outputTerm(out, t->termArg(0));
          out << ")";
          return;
        }

        case SpecialFunctor::ITE: {
          out << "(ite ";
          outputFormula(out, sd->getCondition());
          ASS_EQ(t->numTermArguments(), 2)
          outputTerm(out, t->termArg(0));
          outputTerm(out, t->termArg(1));
          out << ")";
          return;
        }
        case SpecialFunctor::TUPLE: 
            throw UserErrorException("tuples are not supperted in smt2 proofcheck");

        case SpecialFunctor::LAMBDA:
            throw UserErrorException("lambdas are not supperted in smt2 proofcheck");

        case SpecialFunctor::LET_TUPLE: 
            throw UserErrorException("tuples lets are not supperted in smt2 proofcheck");

        case SpecialFunctor::MATCH:
            throw UserErrorException("&match are not supperted in smt2 proofcheck");
      }


    } else {
      // if (isInterpretedByTranslation(t)) {
      //   outputTranslation(out, t);
      //
      // } else {

        if (t->numTermArguments() != 0) {
          out << "(";
        }
        if (t->isLiteral()) {
          outputPredicateName(out, t->functor());
        } else {
          outputFunctionName(out, t->functor());
        }

        for (unsigned i = 0; i < t->numTermArguments(); i++) {
          out << " ";
          outputTerm(out, t->termArg(i));
        }
        if (t->numTermArguments() != 0) {
          out << ")";
        }
      // }
    }
  }